

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O0

int ztlex_isname(ztlex_t *lex)

{
  bool bVar1;
  ushort **ppuVar2;
  long in_RDI;
  int c;
  int i;
  int local_18;
  int local_14;
  int local_4;
  
  local_14 = 0;
  local_18 = (**(code **)(in_RDI + 0x238))(in_RDI);
  if (local_18 == -1) {
    local_4 = -1;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    if ((((*ppuVar2)[local_18] & 0x400) == 0) && (local_18 != 0x5f)) {
      (**(code **)(in_RDI + 0x240))(local_18,in_RDI);
      local_4 = 0;
    }
    else {
      do {
        local_4 = local_14 + 1;
        *(char *)(in_RDI + 0x128 + (long)local_14) = (char)local_18;
        local_18 = (**(code **)(in_RDI + 0x238))(in_RDI);
        ppuVar2 = __ctype_b_loc();
        if ((((*ppuVar2)[local_18] & 8) != 0) || (bVar1 = false, local_18 == 0x5f)) {
          bVar1 = local_4 < 0xff;
        }
        local_14 = local_4;
      } while (bVar1);
      if (((local_18 != -1) && (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[local_18] & 8) == 0)) &&
         (local_18 != 0x5f)) {
        (**(code **)(in_RDI + 0x240))(local_18,in_RDI);
      }
      *(undefined1 *)(in_RDI + 0x128 + (long)local_4) = 0;
    }
  }
  return local_4;
}

Assistant:

int ztlex_isname(ztlex_t *lex)
{
  int i = 0;
  int c;

  c = lex->getC(lex);
  if (c == EOF)
    return EOF;

  if (!(isalpha(c) || c == '_'))
  {
    lex->ungetC(c, lex);
    return 0;
  }

  do
  {
    lex->lexeme[i++] = c;
    c = lex->getC(lex);
  }
  while ((isalnum(c) || c == '_') && i < MAXLEXEME - 1);

  if (c != EOF && !(isalnum(c) || c == '_'))
    lex->ungetC(c, lex);

  lex->lexeme[i] = '\0';
  return i;
}